

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O3

void __thiscall
Refal2::CUnitList::HandyPrint(CUnitList *this,ostream *outputStream,CPrintHelper *printHelper)

{
  bool bVar1;
  bool bVar2;
  TUnitType TVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  CNodeType *pCVar5;
  char *pcVar6;
  undefined8 uStack_38;
  
  pCVar5 = (this->super_CNodeList<Refal2::CUnit>).first;
  if (pCVar5 != (CNodeType *)0x0) {
    bVar1 = false;
    uStack_38 = in_RAX;
    do {
      TVar3 = (pCVar5->super_CUnit).type;
      poVar4 = outputStream;
      if (TVar3 == UT_Char) {
        bVar2 = true;
        if (!bVar1) {
LAB_00132825:
          bVar1 = bVar2;
          std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
          TVar3 = (pCVar5->super_CUnit).type;
          goto LAB_0013283b;
        }
LAB_001328aa:
        uStack_38 = CONCAT17((pCVar5->super_CUnit).field_1.c,(undefined7)uStack_38);
        pcVar6 = (char *)((long)&uStack_38 + 7);
      }
      else {
        if (bVar1) {
          bVar2 = false;
          goto LAB_00132825;
        }
LAB_0013283b:
        if ((int)TVar3 < 0x10) {
          if (TVar3 == UT_Char) goto LAB_001328aa;
          if (TVar3 == UT_Label) {
            std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
            (*printHelper->_vptr_CPrintHelper[1])
                      (printHelper,outputStream,(ulong)(pCVar5->super_CUnit).field_1.number);
          }
          else {
            if (TVar3 != UT_Number) goto LAB_0013296f;
            std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)outputStream);
          }
          pcVar6 = "/";
        }
        else if ((int)TVar3 < 0x40) {
          if (TVar3 == UT_LeftParen) {
            pcVar6 = "(";
          }
          else {
            if (TVar3 != UT_RightParen) {
LAB_0013296f:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                            ,0xa1,
                            "void Refal2::CUnitList::HandyPrint(std::ostream &, const CPrintHelper &) const"
                           );
            }
            pcVar6 = ")";
          }
        }
        else if (TVar3 == UT_LeftBracket) {
          pcVar6 = "<";
        }
        else {
          if (TVar3 != UT_RightBracket) goto LAB_0013296f;
          pcVar6 = ">";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,1);
      pCVar5 = pCVar5->next;
    } while (pCVar5 != (CNode<Refal2::CUnit> *)0x0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
    }
  }
  return;
}

Assistant:

void CUnitList::HandyPrint( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	bool lastWasChar = false;
	for( const CUnitNode* node = GetFirst(); node != 0; node = node->Next() ) {
		if( node->GetType() == UT_Char ) {
			if( !lastWasChar ) {
				outputStream << "'";
				lastWasChar = true;
			}
		} else {
			if( lastWasChar ) {
				outputStream << "'";
				lastWasChar = false;
			}
		}
		switch( node->GetType() ) {
			case UT_Char:
				outputStream << node->Char();
				break;
			case UT_Label:
				outputStream << "/";
				printHelper.Label( outputStream, node->Label() );
				outputStream << "/";
				break;
			case UT_Number:
				outputStream << "/" << node->Number() << "/";
				break;
			case UT_LeftParen:
				outputStream << "(";
				break;
			case UT_RightParen:
				outputStream << ")";
				break;
			case UT_LeftBracket:
				outputStream << "<";
				break;
			case UT_RightBracket:
				outputStream << ">";
				break;
			case UT_Variable:
			default:
				assert( false );
				break;
		}
	}
	if( lastWasChar ) {
		outputStream << "'";
	}
}